

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O1

obj * restore_obj(memfile *mf)

{
  int8_t iVar1;
  int16_t iVar2;
  uint uVar3;
  uint uVar4;
  int32_t iVar5;
  obj *poVar6;
  monst *oextra_src;
  uchar uVar7;
  
  mfmagic_check(mf,0x4a424f);
  uVar3 = mread32(mf);
  uVar7 = (uchar)uVar3;
  poVar6 = (obj *)malloc((ulong)(uint)(int)(char)uVar7 + 0x68);
  memset(poVar6,0,(long)(char)uVar7 + 0x68);
  uVar4 = mread32(mf);
  poVar6->o_id = uVar4;
  uVar4 = mread32(mf);
  poVar6->owt = uVar4;
  iVar5 = mread32(mf);
  poVar6->quan = iVar5;
  iVar5 = mread32(mf);
  poVar6->corpsenm = iVar5;
  uVar4 = mread32(mf);
  poVar6->oeaten = uVar4;
  iVar5 = mread32(mf);
  poVar6->age = iVar5;
  iVar5 = mread32(mf);
  poVar6->owornmask = iVar5;
  uVar4 = mread32(mf);
  iVar2 = mread16(mf);
  poVar6->otyp = iVar2;
  iVar1 = mread8(mf);
  poVar6->ox = iVar1;
  iVar1 = mread8(mf);
  poVar6->oy = iVar1;
  iVar1 = mread8(mf);
  poVar6->spe = iVar1;
  iVar1 = mread8(mf);
  poVar6->oclass = iVar1;
  iVar1 = mread8(mf);
  poVar6->invlet = iVar1;
  iVar1 = mread8(mf);
  poVar6->oartifact = iVar1;
  iVar5 = mread32(mf);
  poVar6->oprops = (long)iVar5;
  iVar5 = mread32(mf);
  poVar6->oprops_known = (long)iVar5;
  iVar1 = mread8(mf);
  poVar6->where = iVar1;
  iVar1 = mread8(mf);
  poVar6->timed = iVar1;
  iVar1 = mread8(mf);
  poVar6->cobj = (obj *)(ulong)(iVar1 != '\0');
  poVar6->onamelth = uVar7;
  *(uint *)&poVar6->field_0x4a =
       (uVar4 & 0x10) << 0x17 | *(uint *)&poVar6->field_0x4a & 0xf0000000 |
       (uVar4 & 0x20) << 0x15 |
       (uVar4 & 0x40) << 0x13 |
       (uVar4 & 0x80) << 0x11 |
       (uVar4 & 0x100) << 0xf |
       (uVar4 & 0x600) << 0xc | (uVar4 & 0x800) << 9 | (uVar4 & 0x1000) << 7 | uVar4 * 8 & 0x70000 |
       uVar4 >> 1 & 0x8000 |
       uVar4 >> 3 & 0x4000 |
       uVar4 >> 5 & 0x2000 |
       uVar4 >> 7 & 0x1000 | uVar4 >> 10 & 0xc00 | uVar4 >> 0xe & 0x300 | uVar4 >> 0x11 & 0x80 |
       uVar4 >> 0x13 & 0x40 |
       uVar4 >> 0x15 & 0x20 |
       uVar4 >> 0x17 & 0x10 |
       uVar4 >> 0x19 & 8 | uVar4 >> 0x1b & 4 | uVar4 >> 0x1d & 2 | uVar4 >> 0x1f;
  if (uVar7 != '\0') {
    mread(mf,(void *)((long)poVar6->oextra + (long)poVar6->oxlth),uVar3 & 0xff);
  }
  uVar3 = *(uint *)&poVar6->field_0x4a >> 0x15 & 3;
  if (uVar3 != 2) {
    if (uVar3 == 1) {
      oextra_src = restore_mon(mf);
      poVar6 = realloc_obj(poVar6,(uint)oextra_src->mnamelth + (int)oextra_src->mxlth + 0x78,
                           oextra_src,(uint)poVar6->onamelth,
                           (char *)((long)poVar6->oextra + (long)poVar6->oxlth));
      free(oextra_src);
    }
    return poVar6;
  }
  uVar3 = mread32(mf);
  poVar6 = obj_attach_mid(poVar6,uVar3);
  return poVar6;
}

Assistant:

struct obj *restore_obj(struct memfile *mf)
{
    unsigned int oflags;
    char namelen;
    struct obj *otmp;
    
    mfmagic_check(mf, OBJ_MAGIC);
    
    namelen = mread32(mf);
    otmp = newobj(namelen);
    memset(otmp, 0, namelen + sizeof(struct obj));
    
    otmp->o_id = mread32(mf);
    otmp->owt = mread32(mf);
    otmp->quan = mread32(mf);
    otmp->corpsenm = mread32(mf);
    otmp->oeaten = mread32(mf);
    otmp->age = mread32(mf);
    otmp->owornmask = mread32(mf);
    oflags = mread32(mf);
    
    otmp->otyp = mread16(mf);
    
    otmp->ox = mread8(mf);
    otmp->oy = mread8(mf);
    otmp->spe = mread8(mf);
    otmp->oclass = mread8(mf);
    otmp->invlet = mread8(mf);
    otmp->oartifact = mread8(mf);
    otmp->oprops = mread32(mf);
    otmp->oprops_known = mread32(mf);
    otmp->where = mread8(mf);
    otmp->timed = mread8(mf);
    otmp->cobj = mread8(mf) ? (void*)1 : NULL; /* set the pointer to 1 if there will be contents */
    otmp->onamelth = namelen;
    
    otmp->cursed	= (oflags >> 31) & 1;
    otmp->blessed	= (oflags >> 30) & 1;
    otmp->unpaid	= (oflags >> 29) & 1;
    otmp->no_charge	= (oflags >> 28) & 1;
    otmp->known 	= (oflags >> 27) & 1;
    otmp->dknown	= (oflags >> 26) & 1;
    otmp->bknown	= (oflags >> 25) & 1;
    otmp->rknown	= (oflags >> 24) & 1;
    otmp->oeroded	= (oflags >> 22) & 3;
    otmp->oeroded2	= (oflags >> 20) & 3;
    otmp->oerodeproof	= (oflags >> 19) & 1;
    otmp->olocked	= (oflags >> 18) & 1;
    otmp->obroken	= (oflags >> 17) & 1;
    otmp->otrapped	= (oflags >> 16) & 1;
    otmp->recharged	= (oflags >> 13) & 7;
    otmp->lamplit	= (oflags >> 12) & 1;
    otmp->greased	= (oflags >> 11) & 1;
    otmp->oattached	= (oflags >>  9) & 3;
    otmp->in_use	= (oflags >>  8) & 1;
    otmp->was_dropped	= (oflags >>  7) & 1;
    otmp->was_thrown	= (oflags >>  6) & 1;
    otmp->bypass	= (oflags >>  5) & 1;
    otmp->odrained	= (oflags >>  4) & 1;
    
    if (otmp->onamelth)
	mread(mf, ONAME(otmp), otmp->onamelth);
    
    if (otmp->oattached == OATTACHED_MONST) {
	struct monst *mtmp = restore_mon(mf);
	int monlen = sizeof(struct monst) + mtmp->mnamelth + mtmp->mxlth;
	otmp = realloc_obj(otmp, monlen, mtmp, otmp->onamelth, ONAME(otmp));
	dealloc_monst(mtmp);
    } else if (otmp->oattached == OATTACHED_M_ID) {
	unsigned int mid = mread32(mf);
	otmp = obj_attach_mid(otmp, mid);
    }
    
    return otmp;
}